

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.h
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::CopyFrom
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *mat)

{
  TPZBlockDiagonal<std::complex<float>_> *pTVar1;
  
  if (mat != (TPZMatrix<std::complex<float>_> *)0x0) {
    pTVar1 = (TPZBlockDiagonal<std::complex<float>_> *)
             __dynamic_cast(mat,&TPZMatrix<std::complex<float>>::typeinfo,
                            &TPZBlockDiagonal<std::complex<float>>::typeinfo,0);
    if (pTVar1 != (TPZBlockDiagonal<std::complex<float>_> *)0x0) {
      operator=(this,pTVar1);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZBlockDiagonal<std::complex<float>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<float>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.h"
             ,0x38);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZBlockDiagonal<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }